

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdUtils.cpp
# Opt level: O0

void __thiscall
Js::SIMDUtils::SIMDStData(SIMDUtils *this,SIMDValue *data,SIMDValue simdValue,uint8 dataWidth)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint8 dataWidth_local;
  SIMDValue *data_local;
  SIMDValue simdValue_local;
  
  switch(simdValue.field_0._8_1_) {
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SimdUtils.cpp"
                                ,0x69,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    break;
  case '\x10':
    simdValue_local.field_0.i32[1] = simdValue.field_0._4_4_;
    *(Type *)(this + 0xc) = simdValue_local.field_0.i32[1];
  case '\f':
    simdValue_local.field_0.i32[0] = simdValue.field_0._0_4_;
    *(Type *)(this + 8) = simdValue_local.field_0.i32[0];
  case '\b':
    data_local._4_4_ = (undefined4)((ulong)data >> 0x20);
    *(undefined4 *)(this + 4) = data_local._4_4_;
  case '\x04':
    data_local._0_4_ = SUB84(data,0);
    *(undefined4 *)this = data_local._0_4_;
  }
  return;
}

Assistant:

void SIMDUtils::SIMDStData(SIMDValue *data, const SIMDValue simdValue, uint8 dataWidth)
    {
        // bitwise copy. Always use integer fields to avoid wrong copy of NaNs.
        switch (dataWidth)
        {
        case 16:
            data->i32[SIMD_W] = simdValue.i32[SIMD_W];
            // fall through
        case 12:
            data->i32[SIMD_Z] = simdValue.i32[SIMD_Z];
            // fall through
        case 8:
            data->i32[SIMD_Y] = simdValue.i32[SIMD_Y];
            // fall through
        case 4:
            data->i32[SIMD_X] = simdValue.i32[SIMD_X];
            break;
        default:
            Assert(UNREACHED);
        }
    }